

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

DefinitionLookupResult * __thiscall
slang::ast::Compilation::tryGetDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view lookupName,
          Scope *scope)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  value_type_pointer ppVar4;
  RootSymbol *pRVar5;
  pointer ppSVar6;
  SourceLibrary *pSVar7;
  pointer ppSVar8;
  Symbol *this_00;
  uint uVar9;
  hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
  *phVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  InstanceBodySymbol *pIVar14;
  size_t sVar15;
  SourceLibrary *pSVar16;
  ResolvedConfig *parentConfig;
  pointer ppSVar17;
  ulong uVar18;
  RootSymbol *pRVar19;
  ulong uVar20;
  long lVar21;
  RootSymbol *pRVar22;
  value_type_pointer __u;
  pointer ppSVar23;
  value_type_pointer ppVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> local_b8;
  undefined8 local_98;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  undefined8 local_88;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  ulong local_78;
  hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
  *local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  undefined1 local_48 [16];
  pointer local_38;
  
  pIVar14 = Scope::getContainingInstance(scope);
  if ((pIVar14 == (InstanceBodySymbol *)0x0) || (pIVar14->parentInstance == (InstanceSymbol *)0x0))
  {
    parentConfig = (ResolvedConfig *)0x0;
  }
  else {
    parentConfig = pIVar14->parentInstance->resolvedConfig;
  }
  local_70 = (hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
              *)&this->definitionMap;
  local_b8.first.definition =
       &((this->root)._M_t.
         super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
         .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->super_Symbol;
  if ((RootSymbol *)local_b8.first.definition != (RootSymbol *)0x0) {
    local_b8.first.definition = (Symbol *)&((RootSymbol *)local_b8.first.definition)->super_Scope;
  }
  local_b8.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
  local_b8.first.configRule = (ConfigRule *)lookupName._M_str;
  sVar15 = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     (local_70,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                *)&local_b8);
  uVar20 = sVar15 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar21 = (sVar15 & 0xff) * 4;
  uVar27 = (&UNK_0040c7ac)[lVar21];
  uVar28 = (&UNK_0040c7ad)[lVar21];
  uVar29 = (&UNK_0040c7ae)[lVar21];
  bVar30 = (&UNK_0040c7af)[lVar21];
  uVar18 = 0;
  uVar31 = uVar27;
  uVar32 = uVar28;
  uVar33 = uVar29;
  bVar34 = bVar30;
  uVar35 = uVar27;
  uVar36 = uVar28;
  uVar37 = uVar29;
  bVar38 = bVar30;
  uVar39 = uVar27;
  uVar40 = uVar28;
  uVar41 = uVar29;
  bVar42 = bVar30;
  do {
    pgVar2 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar20;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bVar12 = pgVar1->m[0xf].n;
    auVar25[0] = -(local_58 == uVar27);
    auVar25[1] = -(uStack_57 == uVar28);
    auVar25[2] = -(uStack_56 == uVar29);
    auVar25[3] = -(bStack_55 == bVar30);
    auVar25[4] = -(uStack_54 == uVar31);
    auVar25[5] = -(uStack_53 == uVar32);
    auVar25[6] = -(uStack_52 == uVar33);
    auVar25[7] = -(bStack_51 == bVar34);
    auVar25[8] = -(uStack_50 == uVar35);
    auVar25[9] = -(uStack_4f == uVar36);
    auVar25[10] = -(uStack_4e == uVar37);
    auVar25[0xb] = -(bStack_4d == bVar38);
    auVar25[0xc] = -(uStack_4c == uVar39);
    auVar25[0xd] = -(uStack_4b == uVar40);
    auVar25[0xe] = -(uStack_4a == uVar41);
    auVar25[0xf] = -(bVar12 == bVar42);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar12;
    if (uVar13 != 0) {
      local_88 = (RootSymbol *)
                 CONCAT17(bVar34,CONCAT16(uVar33,CONCAT15(uVar32,CONCAT14(uVar31,CONCAT13(bVar30,
                                                  CONCAT12(uVar29,CONCAT11(uVar28,uVar27)))))));
      ppVar24 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.elements_;
      local_98 = uVar18;
      uStack_80 = uVar35;
      uStack_7f = uVar36;
      uStack_7e = uVar37;
      bStack_7d = bVar38;
      uStack_7c = uVar39;
      uStack_7b = uVar40;
      uStack_7a = uVar41;
      bStack_79 = bVar42;
      do {
        uVar9 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        __u = ppVar24 + uVar20 * 0xf + (ulong)uVar9;
        bVar11 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         *)&local_b8,&__u->first);
        if (bVar11) {
          pRVar22 = (RootSymbol *)scope;
          ppVar24 = __u;
          if ((__u->second).second != true) goto LAB_00263e9a;
          goto LAB_00263d1c;
        }
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
      bVar12 = pgVar2[uVar20].m[0xf].n;
      uVar18 = local_98;
      uVar27 = (uchar)local_88;
      uVar28 = local_88._1_1_;
      uVar29 = local_88._2_1_;
      bVar30 = local_88._3_1_;
      uVar31 = local_88._4_1_;
      uVar32 = local_88._5_1_;
      uVar33 = local_88._6_1_;
      bVar34 = local_88._7_1_;
      uVar35 = uStack_80;
      uVar36 = uStack_7f;
      uVar37 = uStack_7e;
      bVar38 = bStack_7d;
      uVar39 = uStack_7c;
      uVar40 = uStack_7b;
      uVar41 = uStack_7a;
      bVar42 = bStack_79;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)sVar15 & 7] & bVar12) == 0) break;
    uVar3 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar21 = uVar20 + uVar18;
    uVar18 = uVar18 + 1;
    uVar20 = lVar21 + 1U & uVar3;
  } while (uVar18 <= uVar3);
  if (parentConfig != (ResolvedConfig *)0x0) {
    local_48 = (undefined1  [16])0x0;
    local_38 = (pointer)0x0;
    resolveConfigRules(&local_b8,this,lookupName,scope,parentConfig,(ConfigRule *)0x0,
                       (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                       local_48);
    __return_storage_ptr__->configRule = local_b8.first.configRule;
    __return_storage_ptr__->definition = local_b8.first.definition;
    __return_storage_ptr__->configRoot = local_b8.first.configRoot;
    std::_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::~_Vector_base
              ((_Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)local_48
              );
    return __return_storage_ptr__;
  }
  goto LAB_00263f5a;
  while( true ) {
    pRVar5 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    pRVar19 = (RootSymbol *)&pRVar5->super_Scope;
    if (pRVar5 == (RootSymbol *)0x0) {
      pRVar19 = (RootSymbol *)0x0;
    }
    if (pRVar22 == pRVar19) break;
LAB_00263d1c:
    phVar10 = local_70;
    local_b8.first.definition = &pRVar22->super_Symbol;
    local_b8.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
    local_b8.first.configRule = (ConfigRule *)lookupName._M_str;
    local_88 = pRVar22;
    sVar15 = boost::unordered::detail::foa::mulx_mix::
             mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                       (local_70,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                  *)&local_b8);
    uVar18 = sVar15 >> ((byte)*phVar10 & 0x3f);
    lVar21 = (sVar15 & 0xff) * 4;
    uVar27 = (&UNK_0040c7ac)[lVar21];
    uVar28 = (&UNK_0040c7ad)[lVar21];
    uVar29 = (&UNK_0040c7ae)[lVar21];
    bVar30 = (&UNK_0040c7af)[lVar21];
    uVar20 = 0;
    uVar31 = uVar27;
    uVar32 = uVar28;
    uVar33 = uVar29;
    bVar34 = bVar30;
    uVar35 = uVar27;
    uVar36 = uVar28;
    uVar37 = uVar29;
    bVar38 = bVar30;
    uVar39 = uVar27;
    uVar40 = uVar28;
    uVar41 = uVar29;
    bVar42 = bVar30;
    do {
      pgVar2 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar18;
      local_68 = pgVar1->m[0].n;
      uStack_67 = pgVar1->m[1].n;
      uStack_66 = pgVar1->m[2].n;
      bStack_65 = pgVar1->m[3].n;
      uStack_64 = pgVar1->m[4].n;
      uStack_63 = pgVar1->m[5].n;
      uStack_62 = pgVar1->m[6].n;
      bStack_61 = pgVar1->m[7].n;
      uStack_60 = pgVar1->m[8].n;
      uStack_5f = pgVar1->m[9].n;
      uStack_5e = pgVar1->m[10].n;
      bStack_5d = pgVar1->m[0xb].n;
      uStack_5c = pgVar1->m[0xc].n;
      uStack_5b = pgVar1->m[0xd].n;
      uStack_5a = pgVar1->m[0xe].n;
      bVar12 = pgVar1->m[0xf].n;
      auVar26[0] = -(local_68 == uVar27);
      auVar26[1] = -(uStack_67 == uVar28);
      auVar26[2] = -(uStack_66 == uVar29);
      auVar26[3] = -(bStack_65 == bVar30);
      auVar26[4] = -(uStack_64 == uVar31);
      auVar26[5] = -(uStack_63 == uVar32);
      auVar26[6] = -(uStack_62 == uVar33);
      auVar26[7] = -(bStack_61 == bVar34);
      auVar26[8] = -(uStack_60 == uVar35);
      auVar26[9] = -(uStack_5f == uVar36);
      auVar26[10] = -(uStack_5e == uVar37);
      auVar26[0xb] = -(bStack_5d == bVar38);
      auVar26[0xc] = -(uStack_5c == uVar39);
      auVar26[0xd] = -(uStack_5b == uVar40);
      auVar26[0xe] = -(uStack_5a == uVar41);
      auVar26[0xf] = -(bVar12 == bVar42);
      uVar13 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
      bStack_59 = bVar12;
      if (uVar13 != 0) {
        local_98 = CONCAT17(bVar34,CONCAT16(uVar33,CONCAT15(uVar32,CONCAT14(uVar31,CONCAT13(bVar30,
                                                  CONCAT12(uVar29,CONCAT11(uVar28,uVar27)))))));
        ppVar4 = (this->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.elements_;
        uStack_90 = uVar35;
        uStack_8f = uVar36;
        uStack_8e = uVar37;
        bStack_8d = bVar38;
        uStack_8c = uVar39;
        uStack_8b = uVar40;
        uStack_8a = uVar41;
        bStack_89 = bVar42;
        local_78 = uVar18;
        do {
          uVar9 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          ppVar24 = ppVar4 + uVar18 * 0xf + (ulong)uVar9;
          bVar11 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)&local_b8,&ppVar24->first);
          if (bVar11) goto LAB_00263e9a;
          uVar13 = uVar13 - 1 & uVar13;
        } while (uVar13 != 0);
        bVar12 = pgVar2[uVar18].m[0xf].n;
        uVar18 = local_78;
        uVar27 = (uchar)local_98;
        uVar28 = local_98._1_1_;
        uVar29 = local_98._2_1_;
        bVar30 = local_98._3_1_;
        uVar31 = local_98._4_1_;
        uVar32 = local_98._5_1_;
        uVar33 = local_98._6_1_;
        bVar34 = local_98._7_1_;
        uVar35 = uStack_90;
        uVar36 = uStack_8f;
        uVar37 = uStack_8e;
        bVar38 = bStack_8d;
        uVar39 = uStack_8c;
        uVar40 = uStack_8b;
        uVar41 = uStack_8a;
        bVar42 = bStack_89;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)sVar15 & 7] & bVar12) == 0) break;
      uVar3 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
      lVar21 = uVar18 + uVar20;
      uVar20 = uVar20 + 1;
      uVar18 = lVar21 + 1U & uVar3;
    } while (uVar20 <= uVar3);
    pRVar22 = *(RootSymbol **)((local_88->super_Symbol).name._M_len + 0x20);
    ppVar24 = __u;
    if (pRVar22 == (RootSymbol *)0x0) break;
  }
LAB_00263e9a:
  if (parentConfig != (ResolvedConfig *)0x0) {
    resolveConfigRules(&local_b8,this,lookupName,scope,parentConfig,(ConfigRule *)0x0,
                       &(ppVar24->second).first);
    __return_storage_ptr__->configRule = local_b8.first.configRule;
    __return_storage_ptr__->definition = local_b8.first.definition;
    __return_storage_ptr__->configRoot = local_b8.first.configRoot;
    return __return_storage_ptr__;
  }
  ppSVar6 = (this->defaultLiblist).
            super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar23 = (this->defaultLiblist).
                  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppSVar23 != ppSVar6;
      ppSVar23 = ppSVar23 + 1) {
    pSVar7 = *ppSVar23;
    ppSVar17 = (ppVar24->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppSVar8 = (ppVar24->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while (ppSVar17 != ppSVar8) {
      this_00 = *ppSVar17;
      pSVar16 = Symbol::getSourceLibrary(this_00);
      ppSVar17 = ppSVar17 + 1;
      if (pSVar16 == pSVar7) {
        __return_storage_ptr__->definition = this_00;
        goto LAB_00263f2e;
      }
    }
  }
  ppSVar17 = (ppVar24->second).first.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppSVar17 !=
      (ppVar24->second).first.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __return_storage_ptr__->definition = *ppSVar17;
LAB_00263f2e:
    __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
    __return_storage_ptr__->configRule = (ConfigRule *)0x0;
    return __return_storage_ptr__;
  }
LAB_00263f5a:
  __return_storage_ptr__->definition = (Symbol *)0x0;
  __return_storage_ptr__->configRoot = (ConfigBlockSymbol *)0x0;
  __return_storage_ptr__->configRule = (ConfigRule *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::tryGetDefinition(std::string_view lookupName,
                                                                  const Scope& scope) const {
    // Try to find a config block for this scope to help choose the right definition.
    const ResolvedConfig* resolvedConfig = nullptr;
    if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
        resolvedConfig = inst->parentInstance->resolvedConfig;

    // Always search in the root scope to start. Most definitions are global.
    auto it = definitionMap.find({lookupName, root.get()});
    if (it == definitionMap.end()) {
        // If there's a config it might be able to provide an
        // override for this cell name.
        if (resolvedConfig)
            return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, {}).first;
        return {};
    }

    // If the second flag is set it means there are nested modules
    // with this name, so we need to do full scope resolution.
    if (it->second.second) {
        auto searchScope = &scope;
        do {
            auto scopeIt = definitionMap.find({lookupName, searchScope});
            if (scopeIt != definitionMap.end()) {
                it = scopeIt;
                break;
            }

            searchScope = searchScope->asSymbol().getParentScope();
        } while (searchScope && searchScope != root.get());
    }

    auto& defList = it->second.first;
    if (resolvedConfig)
        return resolveConfigRules(lookupName, scope, resolvedConfig, nullptr, defList).first;

    // If there is a global priority list try to use that.
    for (auto lib : defaultLiblist) {
        for (auto def : defList) {
            if (def->getSourceLibrary() == lib)
                return def;
        }
    }

    // Otherwise return the first definition in the list -- it's already
    // sorted in priority order.
    return defList.empty() ? DefinitionLookupResult{} : DefinitionLookupResult{defList.front()};
}